

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

symbol * get_base_symbol_type(dmr_C *C,access_data *ad)

{
  tokenizer_state_t *ptVar1;
  char *pcVar2;
  symbol *psVar3;
  
  ptVar1 = C->T;
  if (ptVar1->input_stream_nr == 1) {
    if (**(char **)(ptVar1->special + 0xc) != ')') goto LAB_00131cf2;
    pcVar2 = *(char **)(ptVar1->special + 0xc) + 0x30;
  }
  else {
    if (ptVar1->input_stream_nr != 2) {
LAB_00131cf2:
      psVar3 = (symbol *)0x0;
      goto LAB_00131cf4;
    }
    pcVar2 = ptVar1->special + 0xc;
  }
  psVar3 = *(symbol **)pcVar2;
LAB_00131cf4:
  if (psVar3 == (symbol *)0x0) {
    psVar3 = (symbol *)0x0;
  }
  else {
    if (*(char *)psVar3 == '\x03') {
      psVar3 = (psVar3->field_14).field_2.ctype.base_type;
    }
    if (*(char *)psVar3 == '\x04') {
      psVar3 = (psVar3->field_14).field_2.ctype.base_type;
    }
  }
  return psVar3;
}

Assistant:

static struct symbol *get_base_symbol_type(struct dmr_C *C, struct access_data *ad) {
        (void) C;
	struct symbol *orig_type = NULL;
	if (ad->address->type == PSEUDO_SYM) {
		orig_type = ad->address->sym;
	}
	else if (ad->address->type == PSEUDO_REG) {
		if (ad->address->def->opcode == OP_LOAD) {
			orig_type = ad->address->def->orig_type;
		}
	}
	if (orig_type) {
		if (orig_type->type == SYM_NODE)
			orig_type = orig_type->ctype.base_type;
		if (orig_type->type == SYM_PTR)
			orig_type = orig_type->ctype.base_type;
		//dmrC_show_type(C, orig_type);
	}
	return orig_type;
}